

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int atom)

{
  JSValueUnion JVar1;
  int iVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  JSValue func_obj;
  JSValue JVar6;
  JSValue JVar7;
  JSValue local_78;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  local_60 = this_val.tag;
  local_68 = this_val.u;
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
    JVar6 = (JSValue)(ZEXT816(6) << 0x40);
    uVar4 = 0;
    goto LAB_00158716;
  }
  JVar1 = argv->u;
  iVar3 = argv->tag;
  JVar7 = *argv;
  JVar6 = *argv;
  if (((uint)iVar3 & 0xfffffffe) == 2) {
LAB_0015858c:
    func_obj = JS_ToString(ctx,this_val);
    if ((int)func_obj.tag != 6) {
      local_78 = func_obj;
      local_58 = JVar1;
      local_50 = iVar3;
      if (atom == 200) {
        JVar6 = JS_NewString(ctx,"g");
        iVar3 = JVar6.tag;
        if ((int)JVar6.tag == 6) goto LAB_00158708;
        uVar4 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar6.u._0_4_;
        iVar2 = 2;
        local_48 = JVar6;
      }
      else {
        iVar3 = 3;
        iVar2 = 1;
        uVar5 = 0;
        uVar4 = 0;
      }
      JVar7 = JS_CallConstructor(ctx,ctx->regexp_ctor,iVar2,(JSValue *)&local_58);
      JVar6.tag = iVar3;
      JVar6.u.ptr = (void *)(uVar5 | uVar4);
      JS_FreeValue(ctx,JVar6);
      if ((int)JVar7.tag != 6) {
        JVar6 = JS_InvokeFree(ctx,JVar7,atom,1,&local_78);
        JS_FreeValue(ctx,local_78);
        uVar4 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
        goto LAB_00158716;
      }
LAB_00158708:
      JS_FreeValue(ctx,func_obj);
    }
  }
  else {
    func_obj = JS_GetPropertyInternal(ctx,*argv,atom,*argv,0);
    if ((uint)func_obj.tag != 6) {
      if ((atom != 200) || (iVar2 = check_regexp_g_flag(ctx,JVar6), -1 < iVar2)) {
        if (((uint)func_obj.tag & 0xfffffffe) != 2) {
          JVar6 = JS_CallFree(ctx,func_obj,JVar7,1,(JSValue *)&local_68);
          uVar4 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
          goto LAB_00158716;
        }
        goto LAB_0015858c;
      }
      goto LAB_00158708;
    }
  }
  uVar4 = 0;
  JVar6 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00158716:
  JVar7.u.ptr = (void *)((ulong)JVar6.u.ptr & 0xffffffff | uVar4);
  JVar7.tag = JVar6.tag;
  return JVar7;
}

Assistant:

static JSValue js_string_match(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int atom)
{
    // match(rx), search(rx), matchAll(rx)
    // atom is JS_ATOM_Symbol_match, JS_ATOM_Symbol_search, or JS_ATOM_Symbol_matchAll
    JSValueConst O = this_val, regexp = argv[0], args[2];
    JSValue matcher, S, rx, result, str;
    int args_len;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    if (!JS_IsUndefined(regexp) && !JS_IsNull(regexp)) {
        matcher = JS_GetProperty(ctx, regexp, atom);
        if (JS_IsException(matcher))
            return JS_EXCEPTION;
        if (atom == JS_ATOM_Symbol_matchAll) {
            if (check_regexp_g_flag(ctx, regexp) < 0) {
                JS_FreeValue(ctx, matcher);
                return JS_EXCEPTION;
            }
        }
        if (!JS_IsUndefined(matcher) && !JS_IsNull(matcher)) {
            return JS_CallFree(ctx, matcher, regexp, 1, &O);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        return JS_EXCEPTION;
    args_len = 1;
    args[0] = regexp;
    str = JS_UNDEFINED;
    if (atom == JS_ATOM_Symbol_matchAll) {
        str = JS_NewString(ctx, "g");
        if (JS_IsException(str))
            goto fail;
        args[args_len++] = (JSValueConst)str;
    }
    rx = JS_CallConstructor(ctx, ctx->regexp_ctor, args_len, args);
    JS_FreeValue(ctx, str);
    if (JS_IsException(rx)) {
    fail:
        JS_FreeValue(ctx, S);
        return JS_EXCEPTION;
    }
    result = JS_InvokeFree(ctx, rx, atom, 1, (JSValueConst *)&S);
    JS_FreeValue(ctx, S);
    return result;
}